

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineMultisampleTests.cpp
# Opt level: O0

VkPipelineMultisampleStateCreateInfo *
vkt::pipeline::anon_unknown_0::AlphaToOneTest::getAlphaToOneStateParams
          (VkPipelineMultisampleStateCreateInfo *__return_storage_ptr__,
          VkSampleCountFlagBits rasterizationSamples)

{
  VkSampleCountFlagBits rasterizationSamples_local;
  
  __return_storage_ptr__->sType = VK_STRUCTURE_TYPE_PIPELINE_MULTISAMPLE_STATE_CREATE_INFO;
  __return_storage_ptr__->pNext = (void *)0x0;
  __return_storage_ptr__->flags = 0;
  __return_storage_ptr__->rasterizationSamples = rasterizationSamples;
  __return_storage_ptr__->sampleShadingEnable = 0;
  __return_storage_ptr__->minSampleShading = 0.0;
  __return_storage_ptr__->pSampleMask = (VkSampleMask *)0x0;
  __return_storage_ptr__->alphaToCoverageEnable = 0;
  __return_storage_ptr__->alphaToOneEnable = 1;
  return __return_storage_ptr__;
}

Assistant:

VkPipelineMultisampleStateCreateInfo AlphaToOneTest::getAlphaToOneStateParams (VkSampleCountFlagBits rasterizationSamples)
{
	const VkPipelineMultisampleStateCreateInfo multisampleStateParams =
	{
		VK_STRUCTURE_TYPE_PIPELINE_MULTISAMPLE_STATE_CREATE_INFO,	// VkStructureType							sType;
		DE_NULL,													// const void*								pNext;
		0u,															// VkPipelineMultisampleStateCreateFlags	flags;
		rasterizationSamples,										// VkSampleCountFlagBits					rasterizationSamples;
		false,														// VkBool32									sampleShadingEnable;
		0.0f,														// float									minSampleShading;
		DE_NULL,													// const VkSampleMask*						pSampleMask;
		false,														// VkBool32									alphaToCoverageEnable;
		true														// VkBool32									alphaToOneEnable;
	};

	return multisampleStateParams;
}